

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cc
# Opt level: O2

int __thiscall
iqnet::Connector_base::connect(Connector_base *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Socket *this_00;
  bool bVar1;
  int iVar2;
  Client_timeout *this_01;
  sockaddr *__addr_00;
  Timeout ms;
  Connect_processor connector;
  Reactor<iqnet::Null_lock> reactor;
  
  Reactor<iqnet::Null_lock>::Reactor(&reactor);
  Connect_processor::Connect_processor(&connector,&reactor.super_Reactor_base);
  this_00 = &connector.sock;
  iVar2 = Socket::connect(this_00,(int)this + 8,__addr_00,__len);
  if ((char)iVar2 == '\0') {
    Reactor<iqnet::Null_lock>::register_handler(&reactor,&connector.super_Event_handler,OUTPUT);
    ms = -1;
    if (0 < __fd) {
      ms = __fd * 1000;
    }
    bVar1 = Reactor<iqnet::Null_lock>::handle_events(&reactor,ms);
    if (!bVar1) {
      Socket::close(this_00,ms);
      this_01 = (Client_timeout *)__cxa_allocate_exception(0x18);
      iqxmlrpc::Client_timeout::Client_timeout(this_01);
      __cxa_throw(this_01,&iqxmlrpc::Client_timeout::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = (*this->_vptr_Connector_base[2])(this,this_00);
  }
  else {
    iVar2 = (*this->_vptr_Connector_base[2])(this,this_00);
  }
  Connect_processor::~Connect_processor(&connector);
  Reactor<iqnet::Null_lock>::~Reactor(&reactor);
  return iVar2;
}

Assistant:

iqxmlrpc::Client_connection*
Connector_base::connect(int timeout)
{
  Reactor<Null_lock> reactor;
  Connect_processor connector(reactor);
  bool done = connector.sock.connect( peer_addr );

  if (done)
    return create_connection( connector.sock );

  reactor.register_handler( &connector, Reactor_base::OUTPUT );

  int ms = timeout > 0 ? timeout*1000 : -1;
  if (!reactor.handle_events(ms)) {
    connector.sock.close();
    throw iqxmlrpc::Client_timeout();
  }

  return create_connection( connector.sock );
}